

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_generateSequences
                 (ZSTD_CCtx *zc,ZSTD_Sequence *outSeqs,size_t outSeqsSize,void *src,size_t srcSize)

{
  ZSTD_customMem customMem;
  size_t __size;
  void *dst;
  size_t err_code;
  size_t sStackY_60;
  
  __size = ZSTD_compressBound(srcSize);
  dst = malloc(__size);
  sStackY_60 = 0xffffffffffffffd8;
  if (((int)(zc->requestedParams).targetCBlockSize == 0) && ((zc->requestedParams).nbWorkers == 0))
  {
    if (dst == (void *)0x0) {
      sStackY_60 = 0xffffffffffffffc0;
    }
    else {
      (zc->seqCollector).collectSequences = 1;
      (zc->seqCollector).seqStart = outSeqs;
      (zc->seqCollector).seqIndex = 0;
      (zc->seqCollector).maxSequences = outSeqsSize;
      sStackY_60 = ZSTD_compress2(zc,dst,__size,src,srcSize);
      customMem.opaque = (void *)0x0;
      customMem.customAlloc = (ZSTD_allocFunction)0x0;
      customMem.customFree = (ZSTD_freeFunction)0x0;
      ZSTD_customFree(dst,customMem);
      if (sStackY_60 < 0xffffffffffffff89) {
        sStackY_60 = (zc->seqCollector).seqIndex;
      }
    }
  }
  return sStackY_60;
}

Assistant:

size_t ZSTD_generateSequences(ZSTD_CCtx* zc, ZSTD_Sequence* outSeqs,
                              size_t outSeqsSize, const void* src, size_t srcSize)
{
    const size_t dstCapacity = ZSTD_compressBound(srcSize);
    void* dst = ZSTD_customMalloc(dstCapacity, ZSTD_defaultCMem);
    SeqCollector seqCollector;
    {
        int targetCBlockSize;
        FORWARD_IF_ERROR(ZSTD_CCtx_getParameter(zc, ZSTD_c_targetCBlockSize, &targetCBlockSize), "");
        RETURN_ERROR_IF(targetCBlockSize != 0, parameter_unsupported, "targetCBlockSize != 0");
    }
    {
        int nbWorkers;
        FORWARD_IF_ERROR(ZSTD_CCtx_getParameter(zc, ZSTD_c_nbWorkers, &nbWorkers), "");
        RETURN_ERROR_IF(nbWorkers != 0, parameter_unsupported, "nbWorkers != 0");
    }

    RETURN_ERROR_IF(dst == NULL, memory_allocation, "NULL pointer!");

    seqCollector.collectSequences = 1;
    seqCollector.seqStart = outSeqs;
    seqCollector.seqIndex = 0;
    seqCollector.maxSequences = outSeqsSize;
    zc->seqCollector = seqCollector;

    {
        const size_t ret = ZSTD_compress2(zc, dst, dstCapacity, src, srcSize);
        ZSTD_customFree(dst, ZSTD_defaultCMem);
        FORWARD_IF_ERROR(ret, "ZSTD_compress2 failed");
    }
    assert(zc->seqCollector.seqIndex <= ZSTD_sequenceBound(srcSize));
    return zc->seqCollector.seqIndex;
}